

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  int local_2c;
  int local_28;
  int col;
  int line;
  int res;
  size_t avail;
  xmlChar *cur;
  xmlParserCtxtPtr ctxt_local;
  
  avail = (size_t)ctxt->input->cur;
  _line = (long)ctxt->input->end - avail;
  col = 0;
  local_28 = ctxt->input->line;
  local_2c = ctxt->input->col;
  while (ctxt->disableSAX < 2) {
    if (_line == 0) {
      ctxt->input->cur = (xmlChar *)avail;
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      avail = (size_t)ctxt->input->cur;
      _line = (long)ctxt->input->end - avail;
      if (_line == 0) break;
    }
    if (*(char *)avail == '\n') {
      local_28 = local_28 + 1;
      local_2c = 1;
    }
    else {
      if ((*(char *)avail != ' ') &&
         (((*(byte *)avail < 9 || (0xd < *(byte *)avail)) || (*(char *)avail == '\v')))) break;
      local_2c = local_2c + 1;
    }
    avail = avail + 1;
    _line = _line + -1;
    if (col < 0x7fffffff) {
      col = col + 1;
    }
  }
  ctxt->input->cur = (xmlChar *)avail;
  ctxt->input->line = local_28;
  ctxt->input->col = local_2c;
  if (((8 < col) && ((ctxt->input->flags & 0x40U) == 0)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  return col;
}

Assistant:

static int
htmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur = ctxt->input->cur;
    size_t avail = ctxt->input->end - cur;
    int res = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;

    while (!PARSER_STOPPED(ctxt)) {
        if (avail == 0) {
            ctxt->input->cur = cur;
            GROW;
            cur = ctxt->input->cur;
            avail = ctxt->input->end - cur;

            if (avail == 0)
                break;
        }

        if (*cur == '\n') {
            line++;
            col = 1;
        } else if (IS_WS_HTML(*cur)) {
            col++;
        } else {
            break;
        }

        cur += 1;
        avail -= 1;

	if (res < INT_MAX)
	    res++;
    }

    ctxt->input->cur = cur;
    ctxt->input->line = line;
    ctxt->input->col = col;

    if (res > 8)
        GROW;

    return(res);
}